

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O0

void __thiscall booster::locale::ios_info::ios_info(ios_info *this)

{
  undefined8 *in_RDI;
  string local_38 [56];
  
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  string_set::string_set((string_set *)(in_RDI + 6));
  in_RDI[9] = 0;
  locale::time_zone::global_abi_cxx11_();
  std::__cxx11::string::operator=((string *)(in_RDI + 2),local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

ios_info::ios_info() : 
            flags_(0),
            domain_id_(0),
            d(0)
        {
            time_zone_ = time_zone::global();
        }